

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

bool __thiscall
absl::lts_20240722::cord_internal::CordRepBtree::IsFlat
          (CordRepBtree *this,size_t offset,size_t n,string_view *fragment)

{
  uint uVar1;
  CordRepBtree *pCVar2;
  CordRepBtree *pCVar3;
  CordRep *pCVar4;
  CordRep *pCVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar6 = (this->super_CordRep).length;
  if (uVar6 < n) {
    __assert_fail("n <= this->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x3d7,
                  "bool absl::cord_internal::CordRepBtree::IsFlat(size_t, const size_t, absl::string_view *) const"
                 );
  }
  if (uVar6 - n < offset) {
    __assert_fail("offset <= this->length - n",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x3d8,
                  "bool absl::cord_internal::CordRepBtree::IsFlat(size_t, const size_t, absl::string_view *) const"
                 );
  }
  if (n == 0) {
LAB_001072b0:
    bVar10 = false;
  }
  else {
    uVar1 = (uint)(this->super_CordRep).storage[0];
    while( true ) {
      if (uVar6 <= offset) {
        __assert_fail("offset < length",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x329,
                      "CordRepBtree::Position absl::cord_internal::CordRepBtree::IndexOf(size_t) const"
                     );
      }
      uVar9 = (ulong)(this->super_CordRep).storage[1];
      pCVar2 = (CordRepBtree *)this->edges_[uVar9];
      uVar6 = (pCVar2->super_CordRep).length;
      uVar8 = uVar9;
      if (uVar6 <= offset) {
        do {
          offset = offset - uVar6;
          pCVar2 = (CordRepBtree *)this->edges_[uVar8 + 1];
          uVar8 = uVar8 + 1;
          uVar6 = (pCVar2->super_CordRep).length;
        } while (uVar6 <= offset);
        bVar10 = uVar8 < uVar9;
        uVar9 = uVar8;
        if (bVar10) {
          __assert_fail("index >= begin()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                        ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
        }
      }
      if ((this->super_CordRep).storage[2] <= uVar9) {
        __assert_fail("index < end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      if (uVar6 < offset + n) goto LAB_001072b0;
      if ((int)uVar1 < 1) break;
      uVar1 = uVar1 - 1;
      this = pCVar2;
      if ((pCVar2->super_CordRep).tag != '\x03') {
        __assert_fail("IsBtree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
      }
    }
    bVar10 = true;
    if (fragment != (string_view *)0x0) {
      bVar7 = (pCVar2->super_CordRep).tag;
      if (bVar7 < 5) {
        if (bVar7 != 1) {
LAB_001073c3:
          __assert_fail("IsDataEdge(edge)",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                        ,0x2e,"absl::string_view absl::cord_internal::EdgeData(const CordRep *)");
        }
        pCVar3 = (CordRepBtree *)pCVar2->edges_[1];
        bVar7 = (pCVar3->super_CordRep).tag;
        if (bVar7 < 5) goto LAB_001073c3;
        pCVar5 = pCVar2->edges_[0];
      }
      else {
        pCVar5 = (CordRep *)0x0;
        pCVar3 = pCVar2;
      }
      if (bVar7 < 6) {
        pCVar4 = pCVar3->edges_[0];
      }
      else {
        if (0xf8 < bVar7) goto LAB_001073fd;
        pCVar4 = (CordRep *)(pCVar3->super_CordRep).storage;
      }
      if (uVar6 < offset) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   offset,uVar6);
LAB_001073fd:
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xbb,"const CordRepFlat *absl::cord_internal::CordRep::flat() const");
      }
      if (uVar6 - offset < n) {
        n = uVar6 - offset;
      }
      fragment->_M_len = n;
      fragment->_M_str = (char *)(pCVar5->storage + (long)(pCVar4->storage + (offset - 0x1a)));
    }
  }
  return bVar10;
}

Assistant:

bool CordRepBtree::IsFlat(size_t offset, const size_t n,
                          absl::string_view* fragment) const {
  assert(n <= this->length);
  assert(offset <= this->length - n);
  if (ABSL_PREDICT_FALSE(n == 0)) return false;
  int height = this->height();
  const CordRepBtree* node = this;
  for (;;) {
    const Position front = node->IndexOf(offset);
    const CordRep* edge = node->Edge(front.index);
    if (edge->length < front.n + n) return false;
    if (--height < 0) {
      if (fragment) *fragment = EdgeData(edge).substr(front.n, n);
      return true;
    }
    offset = front.n;
    node = node->Edge(front.index)->btree();
  }
}